

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

Maybe<capnp::_::RawSchema_*&> __thiscall
kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::find<unsigned_long>
          (HashMap<unsigned_long,_capnp::_::RawSchema_*> *this,unsigned_long *key)

{
  Maybe<capnp::_::RawSchema_*&> MVar1;
  Entry *pEVar2;
  ArrayPtr<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> table;
  HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks> local_20 [8];
  long local_18;
  
  pEVar2 = (this->table).rows.builder.ptr;
  table.size_ = (size_t)pEVar2;
  table.ptr = (Entry *)&(this->table).indexes;
  HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>::
  find<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,unsigned_long&>
            (local_20,table,
             (unsigned_long *)((long)(this->table).rows.builder.pos - (long)pEVar2 >> 4));
  pEVar2 = (Entry *)0x0;
  if (local_20[0] != (HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>)0x0) {
    pEVar2 = (this->table).rows.builder.ptr + local_18;
  }
  MVar1.ptr = &pEVar2->value;
  if (pEVar2 == (Entry *)0x0) {
    MVar1.ptr = (RawSchema **)0x0;
  }
  return (Maybe<capnp::_::RawSchema_*&>)MVar1.ptr;
}

Assistant:

kj::Maybe<Value&> HashMap<Key, Value>::find(KeyLike&& key) {
  return table.find(key).map([](Entry& e) -> Value& { return e.value; });
}